

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
cleanAll(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
         *this)

{
  Lit *pLVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = (this->dirties).sz;
  if (0 < iVar2) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pLVar1 = (this->dirties).data;
      if ((this->dirty).data[*(int *)((long)&pLVar1->x + lVar3)] != '\0') {
        clean(this,(Lit *)((long)&pLVar1->x + lVar3));
        iVar2 = (this->dirties).sz;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar4 < iVar2);
  }
  if ((this->dirties).data != (Lit *)0x0) {
    (this->dirties).sz = 0;
  }
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])])
            clean(dirties[i]);
    dirties.clear();
}